

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

void __thiscall Js::Type::SetIsFalsy(Type *this,bool truth)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,truth) == 0) {
    this->flags = this->flags &
                  (TypeFlagMask_HasBeenCached|TypeFlagMask_JsrtExternal|
                   TypeFlagMask_ThisAndPrototypesHaveNoSpecialProperties|TypeFlagMask_SkipsPrototype
                   |TypeFlagMask_EngineExternal|TypeFlagMask_HasSpecialPrototype|
                  TypeFlagMask_AreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties);
  }
  else {
    if ((((((this->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
         threadContext->super_ThreadContextInfo).wellKnownHostTypeIds[0] != this->typeId) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/Type.cpp"
                                  ,0x9a,
                                  "(this->GetScriptContext()->GetThreadContext()->CanBeFalsy(this->GetTypeId()))"
                                  ,
                                  "this->GetScriptContext()->GetThreadContext()->CanBeFalsy(this->GetTypeId())"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    this->flags = this->flags | TypeFlagMask_IsFalsy;
  }
  return;
}

Assistant:

void Type::SetIsFalsy(const bool truth)
    {
        if (truth)
        {
            Assert(this->GetScriptContext()->GetThreadContext()->CanBeFalsy(this->GetTypeId()));
            flags |= TypeFlagMask_IsFalsy;
        }
        else
        {
            flags &= ~TypeFlagMask_IsFalsy;
        }
    }